

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss_functions.cc
# Opt level: O3

float __thiscall
logloss::getUpdate(logloss *this,float prediction,float label,float update_scale,
                  float pred_per_update)

{
  float fVar1;
  double __x;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  fVar1 = expf(prediction * label);
  if (1e-06 <= update_scale * pred_per_update) {
    fVar1 = update_scale * pred_per_update + prediction * label + fVar1;
    dVar3 = (double)fVar1;
    if (1.0 <= fVar1) {
      __x = dVar3 * 0.86 + 0.01;
      dVar2 = log(__x);
      dVar2 = dVar3 - dVar2;
    }
    else {
      __x = exp(dVar3 * 0.8 + -0.65);
      dVar2 = dVar3 * 0.2 + 0.65;
    }
    dVar2 = dVar2 - __x;
    dVar4 = __x + 1.0;
    dVar5 = ((dVar2 + dVar2) / 3.0 + dVar4) * (dVar4 + dVar4);
    fVar1 = -(label * (float)((((dVar2 / dVar4) * (dVar5 - dVar2)) / (dVar5 - (dVar2 + dVar2)) + 1.0
                              ) * __x - dVar3) + prediction) / pred_per_update;
  }
  else {
    fVar1 = (label * update_scale) / (fVar1 + 1.0);
  }
  return fVar1;
}

Assistant:

float getUpdate(float prediction, float label, float update_scale, float pred_per_update)
  {
    float w, x;
    float d = correctedExp(label * prediction);
    if (update_scale * pred_per_update < 1e-6)
    {
      /* As with squared loss, for small eta_t we replace the update
       * with its first order Taylor expansion to avoid numerical problems
       */
      return label * update_scale / (1 + d);
    }
    x = update_scale * pred_per_update + label * prediction + d;
    w = wexpmx(x);
    return -(label * w + prediction) / pred_per_update;
  }